

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeH1.cpp
# Opt level: O2

void TPZShapeH1<pzshape::TPZShapePoint>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZShapeData *data)

{
  TPZManVector<int,_27> TStack_a8;
  
  TPZManVector<int,_27>::TPZManVector(&TStack_a8,connectorders);
  TPZManVector<int,_27>::operator=(&data->fH1ConnectOrders,&TStack_a8);
  TPZManVector<int,_27>::~TPZManVector(&TStack_a8);
  ComputeTransforms<pzshape::TPZShapePoint>
            (ids,&(data->fSideTransforms).super_TPZVec<TPZTransform<double>_>);
  TPZManVector<long,_8>::TPZManVector((TPZManVector<long,_8> *)&TStack_a8,ids);
  TPZManVector<long,_8>::operator=(&data->fCornerNodeIds,(TPZManVector<long,_8> *)&TStack_a8);
  TPZManVector<long,_8>::~TPZManVector((TPZManVector<long,_8> *)&TStack_a8);
  (*(data->fH1NumConnectShape).super_TPZVec<int>._vptr_TPZVec[3])(&data->fH1NumConnectShape,0);
  TPZFMatrix<double>::Resize(&(data->fPhi).super_TPZFMatrix<double>,1,1);
  TPZFMatrix<double>::Resize(&(data->fDPhi).super_TPZFMatrix<double>,0,1);
  return;
}

Assistant:

void TPZShapeH1<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                           const TPZVec<int> &connectorders,
                                           TPZShapeData &data) {
    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    if((ids.size() != ncorner || connectorders.size() != nsides-ncorner) && TSHAPE::Type() != EPoint)
    {
        DebugStop();
    }
    data.fH1ConnectOrders = connectorders;
    ComputeTransforms<TSHAPE>(ids, data.fSideTransforms);
    data.fCornerNodeIds = ids;
    data.fH1NumConnectShape.resize(TSHAPE::NSides-TSHAPE::NCornerNodes);
    int64_t nshape = TSHAPE::NCornerNodes;
    for(int i = TSHAPE::NCornerNodes; i < TSHAPE::NSides; i++)
    {
        int nshapeconnect = TSHAPE::NConnectShapeF(i,connectorders[i-TSHAPE::NCornerNodes]);
        data.fH1NumConnectShape[i-TSHAPE::NCornerNodes] = nshapeconnect;
        nshape += nshapeconnect;
    }
    data.fPhi.Resize(nshape,1);
    data.fDPhi.Resize(TSHAPE::Dimension, nshape);
//    fNodeIds = ids; Should we make it an attribute of the class?
}